

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void log_naughty(CHAR_DATA *ch,char *argument,int logtype)

{
  char *__s;
  size_t sVar1;
  FILE *__stream;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  char *strtime;
  FILE *fp;
  
  __s = ctime(&current_time);
  sVar1 = strlen(__s);
  __s[sVar1 - 1] = '\0';
  __stream = fopen("../logs/glog.txt","a");
  if (__stream != (FILE *)0x0) {
    if (in_EDX == 1) {
      fprintf(__stream,"%s: LOAD- %s is loading %s.\n",__s,*(undefined8 *)(in_RDI + 0xe8),in_RSI);
    }
    if (in_EDX == 2) {
      fprintf(__stream,"%s: SET- %s is setting %s.\n",__s,*(undefined8 *)(in_RDI + 0xe8),in_RSI);
    }
    if (in_EDX == 3) {
      fprintf(__stream,"%s: STRING- %s is stringing %s.\n",__s,*(undefined8 *)(in_RDI + 0xe8),in_RSI
             );
    }
    if (in_EDX == 5) {
      fprintf(__stream,"%s: INDUCT- %s is inducting %s.\n",__s,*(undefined8 *)(in_RDI + 0xe8),in_RSI
             );
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void log_naughty(CHAR_DATA *ch, char *argument, int logtype)
{
	FILE *fp;
	char *strtime;

	strtime = ctime(&current_time);
	strtime[strlen(strtime) - 1] = '\0';

	fp = fopen(GOD_LOG_FILE, "a");

	if (fp != nullptr)
	{
		if (logtype == 1)
			fprintf(fp, "%s: LOAD- %s is loading %s.\n", strtime, ch->name, argument);

		if (logtype == 2)
			fprintf(fp, "%s: SET- %s is setting %s.\n", strtime, ch->name, argument);

		if (logtype == 3)
			fprintf(fp, "%s: STRING- %s is stringing %s.\n", strtime, ch->name, argument);

		if (logtype == 5)
			fprintf(fp, "%s: INDUCT- %s is inducting %s.\n", strtime, ch->name, argument);

		fclose(fp);
	}
}